

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::xr_ogf_v4(xr_ogf_v4 *this)

{
  xr_ogf::xr_ogf(&this->super_xr_ogf,OGF4_VERSION);
  (this->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_v4_00239520;
  xr_ibuf::xr_ibuf(&this->m_ib0);
  xr_swibuf::xr_swibuf(&this->m_swib);
  (this->m_source)._M_dataplus._M_p = (pointer)&(this->m_source).field_2;
  (this->m_source)._M_string_length = 0;
  (this->m_source).field_2._M_local_buf[0] = '\0';
  (this->m_export_tool)._M_dataplus._M_p = (pointer)&(this->m_export_tool).field_2;
  (this->m_export_tool)._M_string_length = 0;
  (this->m_export_tool).field_2._M_local_buf[0] = '\0';
  this->m_fast = (xr_ogf *)0x0;
  (this->m_s_lods)._M_dataplus._M_p = (pointer)&(this->m_s_lods).field_2;
  (this->m_s_lods)._M_string_length = 0;
  (this->m_s_lods).field_2._M_local_buf[0] = '\0';
  this->m_ext_vb_index = 0;
  this->m_ext_vb_offset = 0;
  this->m_ext_vb_size = 0;
  this->m_ext_ib_index = 0;
  this->m_ext_ib_index = 0;
  this->m_ext_ib_offset = 0;
  this->m_ext_ib_size = 0;
  this->m_ext_swib_index = 0;
  return;
}

Assistant:

xr_ogf_v4::xr_ogf_v4(): xr_ogf(OGF4_VERSION), m_fast(0),
	m_ext_vb_index(0), m_ext_vb_offset(0), m_ext_vb_size(0),
	m_ext_ib_index(0), m_ext_ib_offset(0), m_ext_ib_size(0),
	m_ext_swib_index(0) {}